

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::ZeroDelayObserver::setInput(ZeroDelayObserver *this,InputVector *u_k,uint k)

{
  IndexedMatrixArray *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  char *__assertion;
  Matrix local_38;
  
  if ((this->super_ObserverBase).p_ != 0) {
    iVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1b])();
    if ((char)iVar2 == '\0') {
      __assertion = "checkInputVector(u_k) && \"The size of the input vector is incorrect\"";
      uVar3 = 0x3b;
LAB_001e0a27:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                    ,uVar3,
                    "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                   );
    }
    this_00 = &this->u_;
    sVar4 = std::
            deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::size(&(this->u_).v_);
    if ((int)sVar4 == 0) {
      if ((0 < (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows) &&
         (0 < (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols)) {
        uVar3 = IndexedMatrix::getTime(&this->x_);
        if (uVar3 != k) {
          uVar3 = IndexedMatrix::getTime(&this->x_);
          if (uVar3 != k - 1) {
            __assertion = 
            "(!x_.isSet() || x_.getTime()==k || x_.getTime()==k-1) && \"ERROR: The time is set incorrectly for the                           inputs (must be [current_time] or [current_time+1])\""
            ;
            uVar3 = 0x45;
            goto LAB_001e0a27;
          }
        }
      }
    }
    else {
      uVar3 = IndexedMatrixArray::getLastIndex(this_00);
      if (uVar3 != k - 1) {
        bVar1 = IndexedMatrixArray::checkIndex(this_00,k);
        if (!bVar1) {
          __assertion = 
          "(u_.getLastIndex()==k-1 || u_.checkIndex(k)) && \"ERROR: The time is set incorrectly                                 for the inputs (order or gap)\""
          ;
          uVar3 = 0x40;
          goto LAB_001e0a27;
        }
      }
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_38,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_k);
    IndexedMatrixArray::setValue(this_00,&local_38,k);
    free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
  }
  return;
}

Assistant:

void ZeroDelayObserver::setInput
                    (const ObserverBase::InputVector& u_k,unsigned k)
    {
        if (p_>0)
        {
            BOOST_ASSERT(checkInputVector(u_k)
                        && "The size of the input vector is incorrect");

            if (u_.size()>0)
                BOOST_ASSERT ((u_.getLastIndex()==k-1 || u_.checkIndex(k))
                        && "ERROR: The time is set incorrectly \
                                for the inputs (order or gap)");
            else
            {
                BOOST_ASSERT ( (!x_.isSet() || x_.getTime()==k || x_.getTime()==k-1)
                    && "ERROR: The time is set incorrectly for the \
                          inputs (must be [current_time] or [current_time+1])");
            }

            u_.setValue(u_k,k);
        }
    }